

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void __thiscall NetworkNS::Network::Network(Network *this,NetwMin *netw_min,string *filename)

{
  allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_> *this_00;
  value_type psVar1;
  value_type psVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  reference pvVar9;
  ostream *poVar10;
  reference pvVar11;
  reference pvVar12;
  reference psVar13;
  size_type sVar14;
  reference psVar15;
  reference pvVar16;
  reference ppsVar17;
  reference ppsVar18;
  vector<sBead_type,_std::allocator<sBead_type>_> *this_01;
  double dVar19;
  pointer plVar20;
  const_iterator local_6b0;
  _List_node_base *local_6a8;
  value_type local_6a0;
  tNode *temp_1;
  _List_node_base *local_690;
  _Self local_688;
  _List_node_base *local_680;
  _List_node_base *local_678;
  int local_670;
  int local_66c;
  int i_4;
  int nelems;
  const_iterator local_660;
  value_type local_658;
  tNode *temp;
  _Self local_648;
  _List_node_base *local_640;
  _List_iterator<sStrand_*> local_638;
  _List_node_base *local_630;
  _List_iterator<sStrand_*> local_628;
  iterator jt;
  iterator it_4;
  reference psStack_610;
  uint ich;
  _Self local_608;
  _Self local_600;
  iterator it_3;
  undefined1 local_5f0 [8];
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  chains;
  double dist;
  double dzr;
  double dyr;
  double dxr;
  _Self local_5b0;
  iterator it_2;
  reference local_5a0;
  _Self local_598;
  _Self local_590;
  iterator it_1;
  reference local_580;
  _Self local_578;
  _Self local_570;
  iterator it;
  int found;
  int enode;
  int snode;
  tStrand current_strand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  int local_4d0;
  int local_4cc;
  int i_3;
  int nchains;
  tNode current_node;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  int local_3e4;
  undefined1 local_3e0 [4];
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  int local_3a4;
  undefined1 local_3a0 [4];
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  string local_368;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  string local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  int local_2f4;
  undefined1 local_2f0 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  undefined1 local_2b8 [8];
  string current_line;
  undefined1 local_290 [4];
  int iline;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_of_file;
  ifstream data_file;
  int local_44;
  int ihelp;
  int bond_types_line;
  int atom_types_line;
  int pair_coeffs_line_start;
  int masses_line_start;
  int bond_coeffs_line_start;
  int bonds_line_start;
  int atoms_line_start;
  int nstrands;
  int nnodes;
  string *filename_local;
  NetwMin *netw_min_local;
  Network *this_local;
  
  this->_vptr_Network = (_func_int **)&PTR__Network_00125d60;
  std::__cxx11::list<sNode,_std::allocator<sNode>_>::list(&this->nodes);
  std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::list(&this->strands);
  std::__cxx11::
  list<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>,_std::allocator<std::__cxx11::list<sStrand,_std::allocator<sStrand>_>_>_>
  ::list(&this->subchains);
  std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::list(&this->pslip_springs);
  std::vector<sBead_type,_std::allocator<sBead_type>_>::vector(&this->node_types);
  std::vector<sBond_type,_std::allocator<sBond_type>_>::vector(&this->bond_types);
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::vector(&this->sorted_chains);
  atoms_line_start = 0;
  bond_coeffs_line_start = 0;
  masses_line_start = 0;
  pair_coeffs_line_start = 0;
  atom_types_line = 0;
  bond_types_line = 0;
  ihelp = 0;
  local_44 = 0;
  bonds_line_start = 0;
  std::operator<<((ostream *)&std::cout,"#: Initializing network.\n");
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream
            (&lines_of_file.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar7,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_290);
  current_line.field_2._12_4_ = 0;
  while (bVar3 = std::ios::good(), (bVar3 & 1) != 0) {
    std::__cxx11::string::string((string *)local_2b8);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)
               &lines_of_file.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_2b8);
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a975);
    if (lVar8 != -1) {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      atoms_line_start = atoi(pcVar7);
    }
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a97b);
    if (lVar8 != -1) {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bonds_line_start = atoi(pcVar7);
    }
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a981);
    if (lVar8 != -1) {
      bond_coeffs_line_start = current_line.field_2._12_4_;
    }
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a987);
    if (lVar8 != -1) {
      masses_line_start = current_line.field_2._12_4_;
    }
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a98d);
    if (lVar8 != -1) {
      atom_types_line = current_line.field_2._12_4_;
    }
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a994);
    if ((lVar8 != -1) && (lVar8 = std::__cxx11::string::find(local_2b8,0x11a999), lVar8 != -1)) {
      pair_coeffs_line_start = current_line.field_2._12_4_;
    }
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a9a0);
    if ((lVar8 != -1) && (lVar8 = std::__cxx11::string::find(local_2b8,0x11a999), lVar8 != -1)) {
      bond_types_line = current_line.field_2._12_4_;
    }
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a9a5);
    if ((lVar8 != -1) && (lVar8 = std::__cxx11::string::find(local_2b8,0x11a9aa), lVar8 != -1)) {
      ihelp = current_line.field_2._12_4_;
    }
    lVar8 = std::__cxx11::string::find(local_2b8,0x11a9b0);
    if ((lVar8 != -1) && (lVar8 = std::__cxx11::string::find(local_2b8,0x11a9aa), lVar8 != -1)) {
      local_44 = current_line.field_2._12_4_;
    }
    current_line.field_2._12_4_ = current_line.field_2._12_4_ + 1;
    std::__cxx11::string::~string((string *)local_2b8);
  }
  std::ifstream::close();
  pvVar9 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ihelp);
  std::__cxx11::string::string((string *)local_2f0,(string *)pvVar9);
  tokenize(&local_2d0,(string *)local_2f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_290,&local_2d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  std::__cxx11::string::~string((string *)local_2f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_290,0);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar5 = atoi(pcVar7);
  poVar10 = std::operator<<((ostream *)&std::cout,"#: --- Number of bead types: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar5);
  std::operator<<(poVar10," .\n");
  std::vector<sBead_type,_std::allocator<sBead_type>_>::resize(&this->node_types,(long)iVar5);
  for (local_2f4 = 0; local_2f4 < iVar5; local_2f4 = local_2f4 + 1) {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(atom_types_line + 2 + local_2f4));
    std::__cxx11::string::string((string *)&local_330,(string *)pvVar9);
    tokenize(&local_310,&local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290,&local_310);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,1);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dVar19 = atof(pcVar7);
    pvVar11 = std::vector<sBead_type,_std::allocator<sBead_type>_>::operator[]
                        (&this->node_types,(long)local_2f4);
    pvVar11->n_mass = dVar19;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,2);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dVar19 = atof(pcVar7);
    pvVar11 = std::vector<sBead_type,_std::allocator<sBead_type>_>::operator[]
                        (&this->node_types,(long)local_2f4);
    pvVar11->mass = dVar19;
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(bond_types_line + 2 + local_2f4));
    std::__cxx11::string::string((string *)&local_368,(string *)pvVar9);
    tokenize(&local_348,&local_368);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290,&local_348);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,1);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dVar19 = atof(pcVar7);
    pvVar11 = std::vector<sBead_type,_std::allocator<sBead_type>_>::operator[]
                        (&this->node_types,(long)local_2f4);
    pvVar11->r_node = dVar19;
  }
  pvVar9 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_44);
  std::__cxx11::string::string((string *)local_3a0,(string *)pvVar9);
  tokenize(&local_380,(string *)local_3a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_290,&local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_380);
  std::__cxx11::string::~string((string *)local_3a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_290,0);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar5 = atoi(pcVar7);
  poVar10 = std::operator<<((ostream *)&std::cout,"#: --- Number of bond types: ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar5);
  std::operator<<(poVar10," .\n");
  std::vector<sBond_type,_std::allocator<sBond_type>_>::resize(&this->bond_types,(long)iVar5);
  for (local_3a4 = 0; local_3a4 < iVar5; local_3a4 = local_3a4 + 1) {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(pair_coeffs_line_start + 2 + local_3a4));
    std::__cxx11::string::string((string *)local_3e0,(string *)pvVar9);
    tokenize(&local_3c0,(string *)local_3e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290,&local_3c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3c0);
    std::__cxx11::string::~string((string *)local_3e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,1);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dVar19 = atof(pcVar7);
    pvVar12 = std::vector<sBond_type,_std::allocator<sBond_type>_>::operator[]
                        (&this->bond_types,(long)local_3a4);
    pvVar12->spring_coeff = dVar19;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,2);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dVar19 = atof(pcVar7);
    pvVar12 = std::vector<sBond_type,_std::allocator<sBond_type>_>::operator[]
                        (&this->bond_types,(long)local_3a4);
    pvVar12->sq_ete = dVar19;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,3);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dVar19 = atof(pcVar7);
    pvVar12 = std::vector<sBond_type,_std::allocator<sBond_type>_>::operator[]
                        (&this->bond_types,(long)local_3a4);
    pvVar12->kuhnl = dVar19;
  }
  for (local_3e4 = 0; local_3e4 < atoms_line_start; local_3e4 = local_3e4 + 1) {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(bond_coeffs_line_start + 2 + local_3e4));
    std::__cxx11::string::string((string *)&current_node.r_star,(string *)pvVar9);
    tokenize(&local_400,(string *)&current_node.r_star);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290,&local_400);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_400);
    std::__cxx11::string::~string((string *)&current_node.r_star);
    sNode::sNode((sNode *)&i_3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    i_3 = atoi(pcVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,2);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    nchains = atoi(pcVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,4);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    current_node._0_8_ = atof(pcVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,5);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    current_node.Pos[0] = atof(pcVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,6);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    current_node.Pos[1] = atof(pcVar7);
    current_node.pChains.super__Vector_base<sChain_*,_std::allocator<sChain_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    this_01 = &this->node_types;
    pvVar11 = std::vector<sBead_type,_std::allocator<sBead_type>_>::operator[]
                        (this_01,(long)(nchains + -1));
    current_node._128_8_ = pvVar11->n_mass;
    pvVar11 = std::vector<sBead_type,_std::allocator<sBead_type>_>::operator[]
                        (this_01,(long)(nchains + -1));
    current_node.n_mass = pvVar11->mass;
    pvVar11 = std::vector<sBead_type,_std::allocator<sBead_type>_>::operator[]
                        (this_01,(long)(nchains + -1));
    current_node.mass = pvVar11->r_node;
    current_node.r_node = current_node.mass;
    std::__cxx11::list<sNode,_std::allocator<sNode>_>::push_back(&this->nodes,(sNode *)&i_3);
    sNode::~sNode((sNode *)&i_3);
  }
  poVar10 = std::operator<<((ostream *)&std::cout,"#: --- ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,atoms_line_start);
  std::operator<<(poVar10," nodes have been added to the network structure.\n");
  local_4cc = 0;
  for (local_4d0 = 0; local_4d0 < bonds_line_start; local_4d0 = local_4d0 + 1) {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)(masses_line_start + 2 + local_4d0));
    std::__cxx11::string::string((string *)&current_strand.pChain,(string *)pvVar9);
    tokenize(&local_4e8,(string *)&current_strand.pChain);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290,&local_4e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4e8);
    std::__cxx11::string::~string((string *)&current_strand.pChain);
    sStrand::sStrand((sStrand *)&enode);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    enode = atoi(pcVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,1);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    snode = atoi(pcVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,5);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    current_strand.Id = atoi(pcVar7);
    if (local_4cc < current_strand.Id) {
      local_4cc = current_strand.Id;
    }
    current_strand.Type._0_1_ = current_strand.Id == 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,2);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar5 = atoi(pcVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_290,3);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar6 = atoi(pcVar7);
    if ((atoms_line_start < iVar5) || (atoms_line_start < iVar6)) {
      poVar10 = std::operator<<((ostream *)&std::cout,": --- There is a problem at line: ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,masses_line_start + 3 + local_4d0);
      poVar10 = std::operator<<(poVar10," of the data file.\n");
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&tokens.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)(masses_line_start + 2 + local_4d0));
      poVar10 = std::operator<<(poVar10,(string *)pvVar9);
      std::operator<<(poVar10,"\n");
      exit(0);
    }
    it._M_node._4_4_ = 0;
    local_570._M_node =
         (_List_node_base *)std::__cxx11::list<sNode,_std::allocator<sNode>_>::begin(&this->nodes);
    while( true ) {
      local_578._M_node =
           (_List_node_base *)std::__cxx11::list<sNode,_std::allocator<sNode>_>::end(&this->nodes);
      bVar4 = std::operator!=(&local_570,&local_578);
      if ((!bVar4) || (1 < it._M_node._4_4_)) break;
      psVar13 = std::_List_iterator<sNode>::operator*(&local_570);
      if ((psVar13->Id == iVar5) ||
         (psVar13 = std::_List_iterator<sNode>::operator*(&local_570), psVar13->Id == iVar6)) {
        it._M_node._4_4_ = it._M_node._4_4_ + 1;
        psVar13 = std::_List_iterator<sNode>::operator*(&local_570);
        std::vector<int,_std::allocator<int>_>::push_back(&psVar13->OrChains,&current_strand.Id);
        local_580 = std::_List_iterator<sNode>::operator*(&local_570);
        std::vector<sNode_*,_std::allocator<sNode_*>_>::push_back
                  ((vector<sNode_*,_std::allocator<sNode_*>_> *)&current_strand.kuhn_length,
                   &local_580);
      }
      std::_List_iterator<sNode>::operator++(&local_570);
    }
    pvVar12 = std::vector<sBond_type,_std::allocator<sBond_type>_>::operator[]
                        (&this->bond_types,(long)(snode + -1));
    current_strand._16_8_ = pvVar12->spring_coeff;
    pvVar12 = std::vector<sBond_type,_std::allocator<sBond_type>_>::operator[]
                        (&this->bond_types,(long)(snode + -1));
    current_strand.spring_coeff = pvVar12->sq_ete;
    pvVar12 = std::vector<sBond_type,_std::allocator<sBond_type>_>::operator[]
                        (&this->bond_types,(long)(snode + -1));
    current_strand.sq_end_to_end = pvVar12->kuhnl;
    if (((byte)current_strand.Type & 1) != 0) {
      current_strand.OrChain = 0;
    }
    std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::push_back
              (&this->strands,(value_type *)&enode);
    if (((byte)current_strand.Type & 1) != 0) {
      it_1._M_node = (_List_node_base *)
                     std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::back(&this->strands);
      std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                (&this->pslip_springs,(value_type *)&it_1);
    }
    sStrand::~sStrand((sStrand *)&enode);
  }
  local_590._M_node =
       (_List_node_base *)
       std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::begin(&this->strands);
  while( true ) {
    local_598._M_node =
         (_List_node_base *)
         std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::end(&this->strands);
    bVar4 = std::operator!=(&local_590,&local_598);
    if (!bVar4) break;
    psVar15 = std::_List_iterator<sStrand>::operator*(&local_590);
    if ((psVar15->slip_spring & 1U) == 0) {
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_590);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar15->pEnds,0);
      psVar1 = *ppsVar18;
      local_5a0 = std::_List_iterator<sStrand>::operator*(&local_590);
      std::vector<sStrand_*,_std::allocator<sStrand_*>_>::push_back(&psVar1->pStrands,&local_5a0);
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_590);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar15->pEnds,1);
      psVar1 = *ppsVar18;
      it_2._M_node = (_List_node_base *)std::_List_iterator<sStrand>::operator*(&local_590);
      std::vector<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                (&psVar1->pStrands,(value_type *)&it_2);
    }
    std::_List_iterator<sStrand>::operator++(&local_590);
  }
  local_5b0._M_node =
       (_List_node_base *)
       std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::begin(&this->strands);
  while( true ) {
    dxr = (double)std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::end(&this->strands);
    bVar4 = std::operator!=(&local_5b0,(_Self *)&dxr);
    if (!bVar4) break;
    psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
    if ((psVar15->slip_spring & 1U) == 0) {
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar15->pEnds,1);
      dVar19 = (*ppsVar18)->Pos[0];
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar15->pEnds,0);
      dyr = dVar19 - (*ppsVar18)->Pos[0];
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar15->pEnds,1);
      dVar19 = (*ppsVar18)->Pos[1];
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar15->pEnds,0);
      dzr = dVar19 - (*ppsVar18)->Pos[1];
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar15->pEnds,1);
      dVar19 = (*ppsVar18)->Pos[2];
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar15->pEnds,0);
      dist = dVar19 - (*ppsVar18)->Pos[2];
      Domain::minimum_image(netw_min->domain,&dyr,&dzr,&dist);
      plVar20 = (pointer)sqrt(dist * dist + dyr * dyr + dzr * dzr);
      chains.
      super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = plVar20;
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
      dVar19 = psVar15->sq_end_to_end;
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
      if (0.0001 < (double)plVar20 - dVar19 / psVar15->kuhn_length) {
        poVar10 = std::operator<<((ostream *)&std::cout,"Strand ");
        psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,psVar15->Id);
        poVar10 = std::operator<<(poVar10," has length ");
        psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
        dVar19 = psVar15->sq_end_to_end;
        psVar15 = std::_List_iterator<sStrand>::operator*(&local_5b0);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar19 / psVar15->kuhn_length);
        poVar10 = std::operator<<(poVar10," but real dist ");
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            (poVar10,(double)chains.
                                             super__Vector_base<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
    }
    std::_List_iterator<sStrand>::operator++(&local_5b0);
  }
  sVar14 = (size_type)local_4cc;
  this_00 = (allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_> *)
            ((long)&it_3._M_node + 7);
  std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>::allocator(this_00);
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::vector((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
            *)local_5f0,sVar14,this_00);
  std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>::~allocator
            ((allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_> *)
             ((long)&it_3._M_node + 7));
  local_600._M_node =
       (_List_node_base *)
       std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::begin(&this->strands);
  while( true ) {
    local_608._M_node =
         (_List_node_base *)
         std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::end(&this->strands);
    bVar4 = std::operator!=(&local_600,&local_608);
    if (!bVar4) break;
    psVar15 = std::_List_iterator<sStrand>::operator*(&local_600);
    if ((psVar15->slip_spring & 1U) == 0) {
      psVar15 = std::_List_iterator<sStrand>::operator*(&local_600);
      pvVar16 = std::
                vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                              *)local_5f0,(long)(psVar15->OrChain + -1));
      psStack_610 = std::_List_iterator<sStrand>::operator*(&local_600);
      std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back
                (pvVar16,&stack0xfffffffffffff9f0);
    }
    std::_List_iterator<sStrand>::operator++(&local_600);
  }
  std::
  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
  ::resize(&this->sorted_chains,(long)local_4cc);
  it_4._M_node._4_4_ = 0;
  do {
    sVar14 = std::
             vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
             ::size((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                     *)local_5f0);
    if (sVar14 <= it_4._M_node._4_4_) {
LAB_00112205:
      temp._4_4_ = 1;
      std::
      vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
      ::~vector((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                 *)local_5f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ifstream::~ifstream
                (&lines_of_file.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    std::_List_iterator<sStrand_*>::_List_iterator(&jt);
    std::_List_iterator<sStrand_*>::_List_iterator(&local_628);
    pvVar16 = std::
              vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
              ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                            *)local_5f0,(ulong)it_4._M_node._4_4_);
    local_638._M_node =
         (_List_node_base *)
         std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::begin(pvVar16);
    pvVar16 = std::
              vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
              ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                            *)local_5f0,(ulong)it_4._M_node._4_4_);
    local_640 = (_List_node_base *)
                std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::end(pvVar16);
    local_630 = (_List_node_base *)
                std::find_if<std::_List_iterator<sStrand*>,bool(*)(sStrand*)>
                          (local_638,(_List_iterator<sStrand_*>)local_640,pred_strand_is_end);
    local_628 = (_List_iterator<sStrand_*>)local_630;
    pvVar16 = std::
              vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
              ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                            *)local_5f0,(ulong)it_4._M_node._4_4_);
    local_648._M_node =
         (_List_node_base *)std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::end(pvVar16);
    bVar4 = std::operator==(&local_628,&local_648);
    if (bVar4) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Chain with no ends was found: ");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,it_4._M_node._4_4_);
      std::operator<<(poVar10," .\n");
      poVar10 = std::operator<<((ostream *)&std::cout,"Number of strands: ");
      pvVar16 = std::
                vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                              *)local_5f0,(ulong)it_4._M_node._4_4_);
      sVar14 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::size(pvVar16);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar14);
      std::operator<<(poVar10," .\n");
      goto LAB_00112205;
    }
    ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
    ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar17)->pEnds,0);
    if ((*ppsVar18)->Type != 1) {
      ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar17)->pEnds,0);
      local_658 = *ppsVar18;
      ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar17)->pEnds,1);
      psVar1 = *ppsVar18;
      ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar17)->pEnds,0);
      psVar2 = local_658;
      *ppsVar18 = psVar1;
      ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
      ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&(*ppsVar17)->pEnds,1);
      *ppsVar18 = psVar2;
    }
    pvVar16 = std::
              vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
              ::operator[](&this->sorted_chains,(ulong)it_4._M_node._4_4_);
    ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
    std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back(pvVar16,ppsVar17);
    pvVar16 = std::
              vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
              ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                            *)local_5f0,(ulong)it_4._M_node._4_4_);
    sVar14 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::size(pvVar16);
    if (1 < sVar14) {
      pvVar16 = std::
                vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                              *)local_5f0,(ulong)it_4._M_node._4_4_);
      std::_List_const_iterator<sStrand_*>::_List_const_iterator(&local_660,&local_628);
      _i_4 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::erase(pvVar16,local_660);
      pvVar16 = std::
                vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                              *)local_5f0,(ulong)it_4._M_node._4_4_);
      sVar14 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::size(pvVar16);
      local_66c = (int)sVar14;
      for (local_670 = 0; local_670 < local_66c; local_670 = local_670 + 1) {
        pvVar16 = std::
                  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                  ::operator[](&this->sorted_chains,(ulong)it_4._M_node._4_4_);
        local_678 = (_List_node_base *)
                    std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::end(pvVar16);
        jt._M_node = local_678;
        std::_List_iterator<sStrand_*>::operator--(&jt);
        pvVar16 = std::
                  vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                  ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                                *)local_5f0,(ulong)it_4._M_node._4_4_);
        local_680 = (_List_node_base *)
                    std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::begin(pvVar16);
        local_628._M_node = local_680;
        while( true ) {
          pvVar16 = std::
                    vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                    ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                                  *)local_5f0,(ulong)it_4._M_node._4_4_);
          local_688._M_node =
               (_List_node_base *)
               std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::end(pvVar16);
          bVar4 = std::operator!=(&local_628,&local_688);
          if (!bVar4) break;
          ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
          ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                               (&(*ppsVar17)->pEnds,0);
          psVar1 = *ppsVar18;
          ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&jt);
          ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                               (&(*ppsVar17)->pEnds,1);
          if (psVar1 == *ppsVar18) {
            pvVar16 = std::
                      vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                      ::operator[](&this->sorted_chains,(ulong)it_4._M_node._4_4_);
            ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
            std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back(pvVar16,ppsVar17);
            pvVar16 = std::
                      vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                      ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                                    *)local_5f0,(ulong)it_4._M_node._4_4_);
            std::_List_const_iterator<sStrand_*>::_List_const_iterator
                      ((_List_const_iterator<sStrand_*> *)&temp_1,&local_628);
            local_690 = (_List_node_base *)
                        std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::erase
                                  (pvVar16,(const_iterator)temp_1);
            local_628._M_node = local_690;
            break;
          }
          ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
          ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                               (&(*ppsVar17)->pEnds,1);
          psVar1 = *ppsVar18;
          ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&jt);
          ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                               (&(*ppsVar17)->pEnds,1);
          if (psVar1 == *ppsVar18) {
            ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
            ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                 (&(*ppsVar17)->pEnds,0);
            local_6a0 = *ppsVar18;
            ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
            ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                 (&(*ppsVar17)->pEnds,1);
            psVar1 = *ppsVar18;
            ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
            ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                 (&(*ppsVar17)->pEnds,0);
            psVar2 = local_6a0;
            *ppsVar18 = psVar1;
            ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
            ppsVar18 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[]
                                 (&(*ppsVar17)->pEnds,1);
            *ppsVar18 = psVar2;
            pvVar16 = std::
                      vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                      ::operator[](&this->sorted_chains,(ulong)it_4._M_node._4_4_);
            ppsVar17 = std::_List_iterator<sStrand_*>::operator*(&local_628);
            std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::push_back(pvVar16,ppsVar17);
            pvVar16 = std::
                      vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                      ::operator[]((vector<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>,_std::allocator<std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>_>_>
                                    *)local_5f0,(ulong)it_4._M_node._4_4_);
            std::_List_const_iterator<sStrand_*>::_List_const_iterator(&local_6b0,&local_628);
            local_6a8 = (_List_node_base *)
                        std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::erase
                                  (pvVar16,local_6b0);
            local_628._M_node = local_6a8;
            break;
          }
          std::_List_iterator<sStrand_*>::operator++(&local_628);
        }
      }
    }
    it_4._M_node._4_4_ = it_4._M_node._4_4_ + 1;
  } while( true );
}

Assistant:

Network::Network(class NetwMin *netw_min, std::string filename) {

      int nnodes = 0, nstrands = 0, atoms_line_start = 0, bonds_line_start = 0,
              bond_coeffs_line_start = 0, masses_line_start = 0, pair_coeffs_line_start = 0,
              atom_types_line = 0, bond_types_line = 0, ihelp;

      nstrands = 0;
      cout << "#: Initializing network.\n";
      /* Define and open the desired file. */
      ifstream data_file(filename.c_str(), ifstream::in);
      /* Define an array of strings to hold the contents of the file. */
      std::vector <string> lines_of_file;
      std::vector <string> tokens;

      /* Read and search file. */
      int iline = 0;

      while (data_file.good()) {
         /* A temporary string for the current line of the file. */
         std::string current_line;
         getline(data_file, current_line);
         /* Add current line to file's array of lines. */
         lines_of_file.push_back(current_line);

         if (current_line.find("atoms") != string::npos)
            nnodes = atoi(current_line.c_str());
         if (current_line.find("bonds") != string::npos)
            nstrands = atoi(current_line.c_str());
         if (current_line.find("Atoms") != string::npos)
            atoms_line_start = iline;
         if (current_line.find("Bonds") != string::npos)
            bonds_line_start = iline;
         if (current_line.find("Masses") != string::npos)
            masses_line_start = iline;
         if ((current_line.find("Bond") != string::npos)
                 && (current_line.find("Coeffs") != string::npos))
            bond_coeffs_line_start = iline;
         if ((current_line.find("Pair") != string::npos)
                 && (current_line.find("Coeffs") != string::npos))
            pair_coeffs_line_start = iline;
         if ((current_line.find("atom") != string::npos)
                 && (current_line.find("types") != string::npos))
            atom_types_line = iline;
         if ((current_line.find("bond") != string::npos)
                 && (current_line.find("types") != string::npos))
            bond_types_line = iline;

         iline++;
      }
      data_file.close();

      /* Read the masses of the nodes from the corresponding session of the data file. */
      tokens = tokenize(lines_of_file[atom_types_line]);
      ihelp = atoi(tokens[0].c_str());
      cout << "#: --- Number of bead types: " << ihelp << " .\n";
      node_types.resize(ihelp);
      for (int i = 0; i < ihelp; i++) {
         tokens = tokenize(lines_of_file[masses_line_start + i + 2]);
         node_types[i].n_mass = atof(tokens[1].c_str());
         node_types[i].mass = atof(tokens[2].c_str());

         tokens = tokenize(lines_of_file[pair_coeffs_line_start+i+2]);
         node_types[i].r_node = atof(tokens[1].c_str());
      }

      /* Read the bond coefficients from the corresponding section of the data file. */
      tokens = tokenize(lines_of_file[bond_types_line]);
      ihelp = atoi(tokens[0].c_str());
      cout << "#: --- Number of bond types: " << ihelp << " .\n";
      bond_types.resize(ihelp);
      for (int i = 0; i < ihelp; i++){
         tokens = tokenize(lines_of_file[bond_coeffs_line_start + i + 2]);
         bond_types[i].spring_coeff = atof(tokens[1].c_str());
         bond_types[i].sq_ete = atof(tokens[2].c_str());
         bond_types[i].kuhnl = atof(tokens[3].c_str());
      }

      /* Read atom sections which corresponds to nodal points: */
      for (int i = 0; i < nnodes; i++) {
         /* Read and split the line from the input file: */
         tokens = tokenize(lines_of_file[atoms_line_start + 2 + i]);

         
         //int pbcx = atoi(tokens[7].c_str());
         //int pbcy = atoi(tokens[8].c_str());
         //int pbcz = atoi(tokens[9].c_str());
         
         /* Set the attributes of the current node object. */
         tNode current_node;
         current_node.Id = atoi(tokens[0].c_str());
         current_node.Type = atoi(tokens[2].c_str());
         current_node.Pos[0] = atof(tokens[4].c_str()); //+ (double)pbcx*netw_min->domain->XBoxLen;
         current_node.Pos[1] = atof(tokens[5].c_str()); //+ (double)pbcy*netw_min->domain->YBoxLen;
         current_node.Pos[2] = atof(tokens[6].c_str()); //+ (double)pbcz*netw_min->domain->ZBoxLen;
         current_node.node_cell = 0;

         // Read the mass of the nodal point from the "Masses" section of the file.
         current_node.n_mass = node_types[current_node.Type-1].n_mass;
         current_node.mass = node_types[current_node.Type-1].mass;

         /* Pair coeffs come from the data file in Angstrom. */
         current_node.r_node = node_types[current_node.Type-1].r_node;
         current_node.r_star = current_node.r_node;

         nodes.push_back(current_node);
      }
      cout << "#: --- " << nnodes << " nodes have been added to the network structure.\n";


      int nchains = 0;

      for (int i = 0; i < nstrands; i++) {
         /* Read and split the line from the input file: */
         tokens = tokenize(lines_of_file[bonds_line_start + 2 + i]);
         
         /* Create a temporary object: */
         tStrand current_strand;
         current_strand.Id = atoi(tokens[0].c_str());
         current_strand.Type = atoi(tokens[1].c_str());
         current_strand.OrChain = atoi(tokens[5].c_str());
         if (current_strand.OrChain > nchains)
            nchains = current_strand.OrChain;

         if (current_strand.OrChain == 0)
            current_strand.slip_spring = true;
         else
            current_strand.slip_spring = false;

         /* Read the tags of the start and the end of the strand. */
         int snode = atoi(tokens[2].c_str());
         int enode = atoi(tokens[3].c_str());

         if (snode > (nnodes) || enode > (nnodes)){
            cout << ": --- There is a problem at line: " << (bonds_line_start + 2 + i + 1) 
                 << " of the data file.\n" << lines_of_file[bonds_line_start + 2 + i] << "\n";
            exit(0);
         }
         
         /* We have to find the nodal point whose tag is equal to snode: */
         int found = 0;
         for (std::list <tNode>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
            if (found > 1)
               break;
            if ((*it).Id == snode || (*it).Id == enode) {
               found++;
               (*it).OrChains.push_back(current_strand.OrChain);
               current_strand.pEnds.push_back(&(*it));
            }
         }

         /* Spring coeffs comes from the data file in kJ/mol/K/A^2 */
         current_strand.spring_coeff = bond_types[current_strand.Type-1].spring_coeff;
         /* Length of the strand (n*b) comes from the data file in Angstroms. */
         current_strand.sq_end_to_end = bond_types[current_strand.Type-1].sq_ete;
         current_strand.kuhn_length = bond_types[current_strand.Type-1].kuhnl;

         /* Set the creation time of the slip-spring: */
         if (current_strand.slip_spring)
            current_strand.tcreation = 0;
         
         /* and push it back to the list: */
         strands.push_back(current_strand);

         /* 2013/04/09: Also, push back a pointer to the last element of "strands" vector, if 
          *             the inserted strand is a slip spring. */
         if (current_strand.slip_spring)
            pslip_springs.push_back(&(strands.back()));
      }



      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it) {
         /* 2013/04/09: We exclude slip strings from the local registry of strands connected to 
          *             a specific node. Array "pStrands" contains only chain strands, 
          *             not slip-springs!!. */
         if (!(*it).slip_spring) {
            (*it).pEnds[0]->pStrands.push_back(&(*it));
            (*it).pEnds[1]->pStrands.push_back(&(*it));
         }
      }

      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it) {
         if ((*it).slip_spring)
            continue;

         double dxr = (*it).pEnds[1]->Pos[0] - (*it).pEnds[0]->Pos[0];
         double dyr = (*it).pEnds[1]->Pos[1] - (*it).pEnds[0]->Pos[1];
         double dzr = (*it).pEnds[1]->Pos[2] - (*it).pEnds[0]->Pos[2];
         netw_min->domain->minimum_image(dxr, dyr, dzr);

         double dist = sqrt(dxr * dxr + dyr * dyr + dzr * dzr);
         if (dist - (*it).sq_end_to_end / (*it).kuhn_length > tol)
            cout << "Strand " << (*it).Id << " has length " << (*it).sq_end_to_end 
                  / (*it).kuhn_length << " but real dist " << dist << endl;

      }

      /* Categorize strands into chains: */
      std::vector<std::list<tStrand *> > chains(nchains);
      for (std::list<tStrand> ::iterator it = strands.begin(); it != strands.end(); ++it)
         if (!(*it).slip_spring)
            chains[(*it).OrChain - 1].push_back(&(*it));


      /* Loop over all chains: */
      sorted_chains.resize(nchains);

      for (unsigned int ich = 0; ich < chains.size(); ich++) {
         /* Search to find an end of the chain: */
         std::list <tStrand *>::iterator it, jt;
         jt = find_if(chains[ich].begin(), chains[ich].end(), pred_strand_is_end);
         if (jt == chains[ich].end()) {
            cout << "Chain with no ends was found: " << ich << " .\n";
            cout << "Number of strands: " << chains[ich].size() << " .\n";
            return;
         }

         if ((*jt)->pEnds[0]->Type != 1) {
            tNode *temp;
            temp = (*jt)->pEnds[0];
            (*jt)->pEnds[0] = (*jt)->pEnds[1];
            (*jt)->pEnds[1] = temp;
         }
         sorted_chains[ich].push_back((*jt));
         if (chains[ich].size() > 1)
            chains[ich].erase(jt);
         else
            continue;

         int nelems = chains[ich].size();
         for (int i = 0; i < nelems; i++) {
            /* Set the iterator to the end of the sorted list: */
            it = sorted_chains[ich].end();
            --it;

            /* Find the next element: */
            for (jt = chains[ich].begin(); jt != chains[ich].end(); ++jt) {
               /* check whether is connected to the preceeding strand: */
               if ((*jt)->pEnds[0] == (*it)->pEnds[1]) {
                  /* We can append the found strand as is: */
                  sorted_chains[ich].push_back((*jt));
                  /* an delete it from the previous list */
                  jt = chains[ich].erase(jt);
                  break;
               }

               if ((*jt)->pEnds[1] == (*it)->pEnds[1]) {
                  /* We have to change the order of the pointers. */
                  tNode *temp;
                  temp = (*jt)->pEnds[0];
                  (*jt)->pEnds[0] = (*jt)->pEnds[1];
                  (*jt)->pEnds[1] = temp;

                  /* And add it to the list: */
                  sorted_chains[ich].push_back((*jt));
                  jt = chains[ich].erase(jt);
                  break;
               }
            }
         }
      }


      return;
   }